

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtimeline.cpp
# Opt level: O0

void QTimeLine::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  undefined8 *puVar2;
  bool bVar3;
  Direction DVar4;
  QTimeLine *this;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QTimeLine *in_RDI;
  long in_FS_OFFSET;
  QBindable<QTimeLine::Direction> QVar5;
  QBindable<int> QVar6;
  QBindable<QEasingCurve> QVar7;
  void *_v_1;
  void *_v;
  QTimeLine *_t;
  QEasingCurve *in_stack_fffffffffffffef8;
  int count;
  QTimeLine *in_stack_ffffffffffffff00;
  QTimeLine *in_stack_ffffffffffffff08;
  QTimeLine *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  QTimeLine *in_stack_ffffffffffffff20;
  Direction *pDVar8;
  QUntypedPropertyData *local_70;
  QBindableInterface *local_68;
  QUntypedPropertyData *local_60;
  QBindableInterface *local_58;
  QUntypedPropertyData *local_50;
  QBindableInterface *local_48;
  QUntypedPropertyData *local_40;
  QBindableInterface *local_38;
  QUntypedPropertyData *local_30;
  QBindableInterface *local_28;
  QUntypedPropertyData *local_20;
  QBindableInterface *local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff10 = (QTimeLine *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff10) {
    case (QTimeLine *)0x0:
      valueChanged((QTimeLine *)**(undefined8 **)(in_RCX + 8),in_RDI);
      break;
    case (QTimeLine *)0x1:
      frameChanged(in_RDI,**(undefined4 **)(in_RCX + 8));
      break;
    case (QTimeLine *)0x2:
      stateChanged(in_RDI,**(undefined4 **)(in_RCX + 8));
      break;
    case (QTimeLine *)0x3:
      finished(in_RDI);
      break;
    case (QTimeLine *)0x4:
      start(in_stack_ffffffffffffff20);
      break;
    case (QTimeLine *)0x5:
      resume(in_stack_ffffffffffffff10);
      break;
    case (QTimeLine *)0x6:
      stop(in_stack_ffffffffffffff00);
      break;
    case (QTimeLine *)0x7:
      setPaused(in_stack_ffffffffffffff20,SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0));
      break;
    case (QTimeLine *)0x8:
      setCurrentTime(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      break;
    case (QTimeLine *)0x9:
      toggleDirection(in_stack_ffffffffffffff00);
    }
  }
  if ((in_ESI != 5) ||
     ((((bVar3 = QtMocHelpers::indexOfMethod<void(QTimeLine::*)(double,QTimeLine::QPrivateSignal)>
                           (in_RCX,(void **)valueChanged,0,0), !bVar3 &&
        (bVar3 = QtMocHelpers::indexOfMethod<void(QTimeLine::*)(int,QTimeLine::QPrivateSignal)>
                           (in_RCX,(void **)frameChanged,0,1), !bVar3)) &&
       (bVar3 = QtMocHelpers::
                indexOfMethod<void(QTimeLine::*)(QTimeLine::State,QTimeLine::QPrivateSignal)>
                          (in_RCX,(void **)stateChanged,0,2), !bVar3)) &&
      (bVar3 = QtMocHelpers::indexOfMethod<void(QTimeLine::*)(QTimeLine::QPrivateSignal)>
                         (in_RCX,(void **)finished,0,3), !bVar3)))) {
    if (in_ESI == 1) {
      pDVar8 = *(Direction **)in_RCX;
      in_stack_ffffffffffffff08 = (QTimeLine *)(ulong)in_EDX;
      switch(in_stack_ffffffffffffff08) {
      case (QTimeLine *)0x0:
        DVar4 = duration(in_stack_ffffffffffffff00);
        *pDVar8 = DVar4;
        break;
      case (QTimeLine *)0x1:
        DVar4 = updateInterval(in_stack_ffffffffffffff00);
        *pDVar8 = DVar4;
        break;
      case (QTimeLine *)0x2:
        DVar4 = currentTime(in_stack_ffffffffffffff00);
        *pDVar8 = DVar4;
        break;
      case (QTimeLine *)0x3:
        DVar4 = direction(in_stack_ffffffffffffff00);
        *pDVar8 = DVar4;
        break;
      case (QTimeLine *)0x4:
        DVar4 = loopCount(in_stack_ffffffffffffff00);
        *pDVar8 = DVar4;
        break;
      case (QTimeLine *)0x5:
        easingCurve(in_stack_ffffffffffffff08);
        QEasingCurve::operator=((QEasingCurve *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8)
        ;
        QEasingCurve::~QEasingCurve((QEasingCurve *)in_stack_ffffffffffffff00);
      }
    }
    if (in_ESI == 2) {
      this = (QTimeLine *)(ulong)in_EDX;
      count = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
      switch(this) {
      case (QTimeLine *)0x0:
        setDuration(in_stack_ffffffffffffff08,0);
        break;
      case (QTimeLine *)0x1:
        setUpdateInterval(this,count);
        break;
      case (QTimeLine *)0x2:
        setCurrentTime(this,count);
        break;
      case (QTimeLine *)0x3:
        setDirection(in_stack_ffffffffffffff10,(Direction)((ulong)in_stack_ffffffffffffff08 >> 0x20)
                    );
        break;
      case (QTimeLine *)0x4:
        setLoopCount(this,count);
        break;
      case (QTimeLine *)0x5:
        setEasingCurve(this,in_stack_fffffffffffffef8);
      }
    }
    if (in_ESI == 8) {
      switch(in_EDX) {
      case 0:
        QVar6 = bindableDuration(in_stack_ffffffffffffff08);
        puVar2 = *(undefined8 **)in_RCX;
        local_20 = QVar6.super_QUntypedBindable.data;
        *puVar2 = local_20;
        local_18 = QVar6.super_QUntypedBindable.iface;
        puVar2[1] = local_18;
        break;
      case 1:
        QVar6 = bindableUpdateInterval(in_stack_ffffffffffffff08);
        puVar2 = *(undefined8 **)in_RCX;
        local_30 = QVar6.super_QUntypedBindable.data;
        *puVar2 = local_30;
        local_28 = QVar6.super_QUntypedBindable.iface;
        puVar2[1] = local_28;
        break;
      case 2:
        QVar6 = bindableCurrentTime(in_stack_ffffffffffffff08);
        puVar2 = *(undefined8 **)in_RCX;
        local_40 = QVar6.super_QUntypedBindable.data;
        *puVar2 = local_40;
        local_38 = QVar6.super_QUntypedBindable.iface;
        puVar2[1] = local_38;
        break;
      case 3:
        QVar5 = bindableDirection(in_stack_ffffffffffffff08);
        puVar2 = *(undefined8 **)in_RCX;
        local_50 = QVar5.super_QUntypedBindable.data;
        *puVar2 = local_50;
        local_48 = QVar5.super_QUntypedBindable.iface;
        puVar2[1] = local_48;
        break;
      case 4:
        QVar6 = bindableLoopCount(in_stack_ffffffffffffff08);
        puVar2 = *(undefined8 **)in_RCX;
        local_60 = QVar6.super_QUntypedBindable.data;
        *puVar2 = local_60;
        local_58 = QVar6.super_QUntypedBindable.iface;
        puVar2[1] = local_58;
        break;
      case 5:
        QVar7 = bindableEasingCurve(in_stack_ffffffffffffff08);
        puVar2 = *(undefined8 **)in_RCX;
        local_70 = QVar7.super_QUntypedBindable.data;
        *puVar2 = local_70;
        local_68 = QVar7.super_QUntypedBindable.iface;
        puVar2[1] = local_68;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTimeLine::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTimeLine *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->valueChanged((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1])), QPrivateSignal()); break;
        case 1: _t->frameChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])), QPrivateSignal()); break;
        case 2: _t->stateChanged((*reinterpret_cast< std::add_pointer_t<QTimeLine::State>>(_a[1])), QPrivateSignal()); break;
        case 3: _t->finished(QPrivateSignal()); break;
        case 4: _t->start(); break;
        case 5: _t->resume(); break;
        case 6: _t->stop(); break;
        case 7: _t->setPaused((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->setCurrentTime((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 9: _t->toggleDirection(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTimeLine::*)(qreal , QPrivateSignal)>(_a, &QTimeLine::valueChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTimeLine::*)(int , QPrivateSignal)>(_a, &QTimeLine::frameChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTimeLine::*)(QTimeLine::State , QPrivateSignal)>(_a, &QTimeLine::stateChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTimeLine::*)(QPrivateSignal)>(_a, &QTimeLine::finished, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->duration(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->updateInterval(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->currentTime(); break;
        case 3: *reinterpret_cast<Direction*>(_v) = _t->direction(); break;
        case 4: *reinterpret_cast<int*>(_v) = _t->loopCount(); break;
        case 5: *reinterpret_cast<QEasingCurve*>(_v) = _t->easingCurve(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDuration(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setUpdateInterval(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setCurrentTime(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setDirection(*reinterpret_cast<Direction*>(_v)); break;
        case 4: _t->setLoopCount(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setEasingCurve(*reinterpret_cast<QEasingCurve*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDuration(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableUpdateInterval(); break;
        case 2: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableCurrentTime(); break;
        case 3: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDirection(); break;
        case 4: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableLoopCount(); break;
        case 5: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableEasingCurve(); break;
        default: break;
        }
    }
}